

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

XYZ __thiscall pbrt::SampledSpectrum::ToXYZ(SampledSpectrum *this,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  int i;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  XYZ XVar21;
  SampledSpectrum SVar22;
  float local_88 [2];
  int iStack_80;
  int iStack_7c;
  float local_78 [2];
  int iStack_70;
  int iStack_6c;
  float local_68 [2];
  int iStack_60;
  int iStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar17 = in_ZMM1._8_56_;
  auVar13 = in_ZMM0._8_56_;
  SVar22 = DenselySampledSpectrum::Sample(Spectra::x,lambda);
  auVar14._0_8_ = SVar22.values.values._8_8_;
  auVar14._8_56_ = auVar17;
  auVar10._0_8_ = SVar22.values.values._0_8_;
  auVar10._8_56_ = auVar13;
  local_48 = auVar10._0_16_;
  local_58 = auVar14._0_16_;
  SVar22 = DenselySampledSpectrum::Sample(Spectra::y,lambda);
  auVar15._0_8_ = SVar22.values.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar11._0_8_ = SVar22.values.values._0_8_;
  auVar11._8_56_ = auVar13;
  local_28 = auVar11._0_16_;
  local_38 = auVar15._0_16_;
  SVar22 = DenselySampledSpectrum::Sample(Spectra::z,lambda);
  auVar16._0_8_ = SVar22.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar12._0_8_ = SVar22.values.values._0_8_;
  auVar12._8_56_ = auVar13;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(lambda->pdf).values;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)((lambda->pdf).values + 2);
  auVar6 = *(undefined1 (*) [16])(lambda->pdf).values;
  auVar7 = vunpcklpd_avx(local_48,local_58);
  auVar20._0_4_ = auVar7._0_4_ * (this->values).values[0];
  auVar20._4_4_ = auVar7._4_4_ * (this->values).values[1];
  auVar20._8_4_ = auVar7._8_4_ * (this->values).values[2];
  auVar20._12_4_ = auVar7._12_4_ * (this->values).values[3];
  uVar3 = vcmpps_avx512vl(auVar6,ZEXT816(0) << 0x40,4);
  auVar6 = vdivps_avx512vl(auVar20,auVar6);
  fVar1 = (float)((uint)((byte)uVar3 & 1) * auVar6._0_4_);
  local_68[1] = (float)((uint)((byte)(uVar3 >> 1) & 1) * auVar6._4_4_);
  iStack_60 = (uint)((byte)(uVar3 >> 2) & 1) * auVar6._8_4_;
  iStack_5c = (uint)((byte)(uVar3 >> 3) & 1) * auVar6._12_4_;
  lVar5 = 1;
  do {
    fVar1 = fVar1 + local_68[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  auVar6 = vunpcklpd_avx(local_28,local_38);
  auVar7._0_4_ = auVar6._0_4_ * (this->values).values[0];
  auVar7._4_4_ = auVar6._4_4_ * (this->values).values[1];
  auVar7._8_4_ = auVar6._8_4_ * (this->values).values[2];
  auVar7._12_4_ = auVar6._12_4_ * (this->values).values[3];
  auVar6 = vmovlhps_avx(auVar18,auVar19);
  uVar3 = vcmpps_avx512vl(auVar6,ZEXT816(0) << 0x20,4);
  auVar7 = vdivps_avx512vl(auVar7,auVar6);
  fVar2 = (float)((uint)((byte)uVar3 & 1) * auVar7._0_4_);
  local_78[1] = (float)((uint)((byte)(uVar3 >> 1) & 1) * auVar7._4_4_);
  iStack_70 = (uint)((byte)(uVar3 >> 2) & 1) * auVar7._8_4_;
  iStack_6c = (uint)((byte)(uVar3 >> 3) & 1) * auVar7._12_4_;
  lVar5 = 1;
  do {
    fVar2 = fVar2 + local_78[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  auVar7 = vmovlhps_avx(auVar12._0_16_,auVar16._0_16_);
  auVar9._0_4_ = auVar7._0_4_ * (this->values).values[0];
  auVar9._4_4_ = auVar7._4_4_ * (this->values).values[1];
  auVar9._8_4_ = auVar7._8_4_ * (this->values).values[2];
  auVar9._12_4_ = auVar7._12_4_ * (this->values).values[3];
  uVar3 = vcmpps_avx512vl(auVar6,ZEXT816(0) << 0x40,4);
  auVar6 = vdivps_avx512vl(auVar9,auVar6);
  fVar8 = (float)((uint)((byte)uVar3 & 1) * auVar6._0_4_);
  local_88[1] = (float)((uint)((byte)(uVar3 >> 1) & 1) * auVar6._4_4_);
  iStack_80 = (uint)((byte)(uVar3 >> 2) & 1) * auVar6._8_4_;
  iStack_7c = (uint)((byte)(uVar3 >> 3) & 1) * auVar6._12_4_;
  lVar5 = 1;
  do {
    fVar8 = fVar8 + local_88[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
  auVar4._8_4_ = 0x3e800000;
  auVar4._0_8_ = 0x3e8000003e800000;
  auVar4._12_4_ = 0x3e800000;
  auVar7 = vmulps_avx512vl(auVar6,auVar4);
  auVar6._8_4_ = 0x42d5b6bb;
  auVar6._0_8_ = 0x42d5b6bb42d5b6bb;
  auVar6._12_4_ = 0x42d5b6bb;
  auVar6 = vdivps_avx512vl(auVar7,auVar6);
  XVar21.Z = (fVar8 * 0.25) / 106.856895;
  XVar21._0_8_ = auVar6._0_8_;
  return XVar21;
}

Assistant:

XYZ SampledSpectrum::ToXYZ(const SampledWavelengths &lambda) const {
    // Sample the $X$, $Y$, and $Z$ matching curves at _lambda_
    SampledSpectrum X = Spectra::X().Sample(lambda);
    SampledSpectrum Y = Spectra::Y().Sample(lambda);
    SampledSpectrum Z = Spectra::Z().Sample(lambda);

    // Evaluate estimator to compute $(x,y,z)$ coefficients
    SampledSpectrum pdf = lambda.PDF();
    return XYZ(SafeDiv(X * *this, pdf).Average(), SafeDiv(Y * *this, pdf).Average(),
               SafeDiv(Z * *this, pdf).Average()) /
           CIE_Y_integral;
}